

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O2

void Sbd_StoSaveBestDelayCut(Sbd_Sto_t *p,int iObj,int *pCut)

{
  Sbd_Cut_t *pSVar1;
  ulong uVar2;
  
  if (p->Pivot == iObj) {
    pSVar1 = p->ppCuts[p->iCutBest];
    *pCut = *(uint *)&pSVar1->field_0x14 >> 0x1c;
    for (uVar2 = 0; uVar2 < *(uint *)&pSVar1->field_0x14 >> 0x1c; uVar2 = uVar2 + 1) {
      pCut[uVar2 + 1] = pSVar1->pLeaves[uVar2];
    }
    return;
  }
  __assert_fail("iObj == p->Pivot",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut.c"
                ,0x2e5,"void Sbd_StoSaveBestDelayCut(Sbd_Sto_t *, int, int *)");
}

Assistant:

void Sbd_StoSaveBestDelayCut( Sbd_Sto_t * p, int iObj, int * pCut )
{
    Sbd_Cut_t * pCutBest = p->ppCuts[p->iCutBest]; int i;
    assert( iObj == p->Pivot );
    pCut[0] = pCutBest->nLeaves;
    for ( i = 0; i < (int)pCutBest->nLeaves; i++ )
        pCut[i+1] = pCutBest->pLeaves[i];
}